

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

Token * __thiscall Tokenizer::parseChar(Token *__return_storage_ptr__,Tokenizer *this)

{
  bool bVar1;
  TokenizerException *pTVar2;
  char *pcVar3;
  variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_1b8;
  undefined1 local_18a;
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_142;
  allocator<char> local_141;
  string local_140;
  _Optional_payload_base<char> local_11b;
  char local_119;
  variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_118;
  undefined1 local_ea;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a2;
  allocator<char> local_a1;
  string local_a0;
  _Optional_payload_base<char> local_7d;
  char local_7b;
  undefined1 local_7a;
  allocator<char> local_79;
  undefined1 local_78 [5];
  char nextC;
  _Optional_payload_base<char> local_58;
  char local_56 [8];
  char c;
  allocator<char> local_41;
  string local_40;
  _Optional_payload_base<char> local_1a;
  Tokenizer *pTStack_18;
  optional<char> _;
  Tokenizer *this_local;
  
  pTStack_18 = this;
  local_1a = (_Optional_payload_base<char>)next(this);
  bVar1 = std::optional<char>::has_value((optional<char> *)&local_1a);
  if (!bVar1) {
    local_56[1] = 1;
    pTVar2 = (TokenizerException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Expected char constant, found EOF",&local_41);
    TokenizerException::TokenizerException
              (pTVar2,&local_40,this->line_number,this->col_number,&this->current_line);
    local_56[1] = 0;
    __cxa_throw(pTVar2,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
  }
  pcVar3 = std::optional<char>::value((optional<char> *)&local_1a);
  local_56[0] = *pcVar3;
  if (local_56[0] == '\\') {
    local_58 = (_Optional_payload_base<char>)next(this);
    local_1a = local_58;
    bVar1 = std::optional<char>::has_value((optional<char> *)&local_1a);
    if (!bVar1) {
      local_7a = 1;
      pTVar2 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_78,"Expected char constant, found EOF",&local_79);
      TokenizerException::TokenizerException
                (pTVar2,(string *)local_78,this->line_number,this->col_number,&this->current_line);
      local_7a = 0;
      __cxa_throw(pTVar2,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
    }
    pcVar3 = std::optional<char>::value((optional<char> *)&local_1a);
    local_7b = *pcVar3;
    local_7d = (_Optional_payload_base<char>)next(this);
    local_1a = local_7d;
    bVar1 = std::optional<char>::has_value((optional<char> *)&local_1a);
    if (!bVar1) {
      local_a2 = 1;
      pTVar2 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Expected `\'`, found EOF",&local_a1);
      TokenizerException::TokenizerException
                (pTVar2,&local_a0,this->line_number,this->col_number,&this->current_line);
      local_a2 = 0;
      __cxa_throw(pTVar2,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
    }
    pcVar3 = std::optional<char>::value((optional<char> *)&local_1a);
    if (*pcVar3 != '\'') {
      local_ea = 1;
      pTVar2 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"Expected `\'`, found ",&local_e9);
      pcVar3 = std::optional<char>::value((optional<char> *)&local_1a);
      std::operator+(&local_c8,&local_e8,*pcVar3);
      TokenizerException::TokenizerException
                (pTVar2,&local_c8,this->line_number,this->col_number,&this->current_line);
      local_ea = 0;
      __cxa_throw(pTVar2,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
    }
    local_119 = doBackslash(local_7b);
    std::variant<int,double,std::__cxx11::string,bool,char>::variant<char,void,void,char,void>
              ((variant<int,double,std::__cxx11::string,bool,char> *)&local_118,&local_119);
    Token::Token(__return_storage_ptr__,Char,(tokenValue *)&local_118);
    std::
    variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::~variant(&local_118);
  }
  else {
    local_11b = (_Optional_payload_base<char>)next(this);
    local_1a = local_11b;
    bVar1 = std::optional<char>::has_value((optional<char> *)&local_1a);
    if (!bVar1) {
      local_142 = 1;
      pTVar2 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"Expected `\'`, found EOF",&local_141);
      TokenizerException::TokenizerException
                (pTVar2,&local_140,this->line_number,this->col_number,&this->current_line);
      local_142 = 0;
      __cxa_throw(pTVar2,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
    }
    pcVar3 = std::optional<char>::value((optional<char> *)&local_1a);
    if (*pcVar3 != '\'') {
      local_18a = 1;
      pTVar2 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"Expected `\'`, found ",&local_189);
      pcVar3 = std::optional<char>::value((optional<char> *)&local_1a);
      std::operator+(&local_168,&local_188,*pcVar3);
      TokenizerException::TokenizerException
                (pTVar2,&local_168,this->line_number,this->col_number,&this->current_line);
      local_18a = 0;
      __cxa_throw(pTVar2,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
    }
    std::variant<int,double,std::__cxx11::string,bool,char>::variant<char&,void,void,char,void>
              ((variant<int,double,std::__cxx11::string,bool,char> *)&local_1b8,local_56);
    Token::Token(__return_storage_ptr__,Char,(tokenValue *)&local_1b8);
    std::
    variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::~variant(&local_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::parseChar() {
    optional<char> _ = next();
    if (!_.has_value()) {
        throw TokenizerException("Expected char constant, found EOF", line_number, col_number, current_line);
    }
    char c = _.value();
    if (c == '\\') {
        // Get char after backslash
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Expected char constant, found EOF", line_number, col_number, current_line);
        }
        char nextC = _.value();
        // Ensure it ends with a '
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Expected `'`, found EOF", line_number, col_number, current_line);
        }
        if (_.value() != '\'') {
            throw TokenizerException(string("Expected `'`, found ") + _.value(), line_number, col_number, current_line);
        }
        return Token(Char, doBackslash(nextC));
    } else {
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Expected `'`, found EOF", line_number, col_number, current_line);
        }
        if (_.value() != '\'') {
            throw TokenizerException(string("Expected `'`, found ") + _.value(), line_number, col_number, current_line);
        }
        return Token(Char, c);
    }
}